

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

VOID ExitProcess(UINT uExitCode)

{
  DWORD DVar1;
  DWORD DVar2;
  int iVar3;
  BOOL BVar4;
  int *Destination;
  HANDLE pVVar5;
  DWORD old_terminator;
  UINT uExitCode_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  Destination = Volatile<int>::operator&(&terminator);
  DVar1 = GetCurrentThreadId();
  DVar1 = InterlockedCompareExchange(Destination,DVar1,0);
  DVar2 = GetCurrentThreadId();
  if (DVar2 == DVar1) {
    iVar3 = Volatile::operator_cast_to_int((Volatile *)&init_count);
    if (iVar3 < 1) {
      exit(uExitCode);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pVVar5 = GetCurrentProcess();
    PROCEndProcess(pVVar5,uExitCode,0);
  }
  else if (DVar1 != 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    poll((pollfd *)0x0,0,-1);
  }
  BVar4 = PALInitLock();
  if ((BVar4 != 0) && (iVar3 = Volatile::operator_cast_to_int((Volatile *)&init_count), 0 < iVar3))
  {
    pVVar5 = GetCurrentProcess();
    PROCEndProcess(pVVar5,uExitCode,0);
    fprintf(_stderr,"] %s %s:%d","ExitProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x49a);
    fprintf(_stderr,"PROCEndProcess has returned\n");
    fprintf(_stderr,"] %s %s:%d","ExitProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x4a5);
    fprintf(_stderr,"ExitProcess should not return!\n");
    do {
    } while( true );
  }
  exit(uExitCode);
}

Assistant:

PAL_NORETURN
VOID
PALAPI
ExitProcess(
    IN UINT uExitCode)
{
    DWORD old_terminator;

    PERF_ENTRY_ONLY(ExitProcess);
    ENTRY("ExitProcess(uExitCode=0x%x)\n", uExitCode );

    old_terminator = InterlockedCompareExchange(&terminator, GetCurrentThreadId(), 0);

    if (GetCurrentThreadId() == old_terminator)
    {
        // This thread has already initiated termination. This can happen
        // in two ways:
        // 1) DllMain(DLL_PROCESS_DETACH) triggers a call to ExitProcess.
        // 2) PAL_exit() is called after the last PALTerminate().
        // If the PAL is still initialized, we go straight through to
        // PROCEndProcess. If it isn't, we simply exit.
        if (!PALIsInitialized())
        {
            exit(uExitCode);
            ASSERT("exit has returned\n");
        }
        else
        {
            WARN("thread re-called ExitProcess\n");
            PROCEndProcess(GetCurrentProcess(), uExitCode, FALSE);
        }
    }
    else if (0 != old_terminator)
    {
        /* another thread has already initiated the termination process. we
           could just block on the PALInitLock critical section, but then
           PROCSuspendOtherThreads would hang... so sleep forever here, we're
           terminating anyway

           Update: [TODO] PROCSuspendOtherThreads has been removed. Can this
           code be changed? */
        WARN("termination already started from another thread; blocking.\n");
        poll(NULL, 0, INFTIM);
    }

    /* ExitProcess may be called even if PAL is not initialized.
       Verify if process structure exist
    */
    if (PALInitLock() && PALIsInitialized())
    {
        PROCEndProcess(GetCurrentProcess(), uExitCode, FALSE);

        /* Should not get here, because we terminate the current process */
        ASSERT("PROCEndProcess has returned\n");
    }
    else
    {
        exit(uExitCode);

        /* Should not get here, because we terminate the current process */
        ASSERT("exit has returned\n");
    }

    /* this should never get executed */
    ASSERT("ExitProcess should not return!\n");
    while (true);
}